

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O0

void av1_fadst16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int32_t iVar1;
  int8_t *in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int32_t step [16];
  int32_t *bf1;
  int32_t *bf0;
  int32_t stage;
  int32_t *cospi;
  int32_t size;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int32_t *local_48;
  int *local_40;
  int local_34;
  int32_t *local_30;
  undefined4 local_24;
  int8_t *local_20;
  char local_11;
  int32_t *local_10;
  int32_t *local_8;
  
  local_24 = 0x10;
  local_34 = 0;
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  local_8 = in_RDI;
  av1_range_check_buf(0,in_RDI,in_RDI,0x10,*in_RCX);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = *local_8;
  local_10[1] = -local_8[0xf];
  local_10[2] = -local_8[7];
  local_10[3] = local_8[8];
  local_10[4] = -local_8[3];
  local_10[5] = local_8[0xc];
  local_10[6] = local_8[4];
  local_10[7] = -local_8[0xb];
  local_10[8] = -local_8[1];
  local_10[9] = local_8[0xe];
  local_10[10] = local_8[6];
  local_10[0xb] = -local_8[9];
  local_10[0xc] = local_8[2];
  local_10[0xd] = -local_8[0xd];
  local_10[0xe] = -local_8[5];
  local_10[0xf] = local_8[10];
  av1_range_check_buf(local_34,local_8,local_10,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_40 = local_10;
  local_88 = *local_10;
  local_84 = local_10[1];
  local_48 = &local_88;
  iVar1 = half_btf(local_30[0x20],local_10[2],local_30[0x20],local_10[3],(int)local_11);
  local_48[2] = iVar1;
  iVar1 = half_btf(local_30[0x20],local_40[2],-local_30[0x20],local_40[3],(int)local_11);
  local_48[3] = iVar1;
  local_48[4] = local_40[4];
  local_48[5] = local_40[5];
  iVar1 = half_btf(local_30[0x20],local_40[6],local_30[0x20],local_40[7],(int)local_11);
  local_48[6] = iVar1;
  iVar1 = half_btf(local_30[0x20],local_40[6],-local_30[0x20],local_40[7],(int)local_11);
  local_48[7] = iVar1;
  local_48[8] = local_40[8];
  local_48[9] = local_40[9];
  iVar1 = half_btf(local_30[0x20],local_40[10],local_30[0x20],local_40[0xb],(int)local_11);
  local_48[10] = iVar1;
  iVar1 = half_btf(local_30[0x20],local_40[10],-local_30[0x20],local_40[0xb],(int)local_11);
  local_48[0xb] = iVar1;
  local_48[0xc] = local_40[0xc];
  local_48[0xd] = local_40[0xd];
  iVar1 = half_btf(local_30[0x20],local_40[0xe],local_30[0x20],local_40[0xf],(int)local_11);
  local_48[0xe] = iVar1;
  iVar1 = half_btf(local_30[0x20],local_40[0xe],-local_30[0x20],local_40[0xf],(int)local_11);
  local_48[0xf] = iVar1;
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = local_88 + local_80;
  local_10[1] = local_84 + local_7c;
  local_10[2] = local_88 - local_80;
  local_10[3] = local_84 - local_7c;
  local_10[4] = local_78 + local_70;
  local_10[5] = local_74 + local_6c;
  local_10[6] = local_78 - local_70;
  local_10[7] = local_74 - local_6c;
  local_10[8] = local_68 + local_60;
  local_10[9] = local_64 + local_5c;
  local_10[10] = local_68 - local_60;
  local_10[0xb] = local_64 - local_5c;
  local_10[0xc] = local_58 + local_50;
  local_10[0xd] = local_54 + local_4c;
  local_10[0xe] = local_58 - local_50;
  local_10[0xf] = local_54 - local_4c;
  local_40 = &local_88;
  av1_range_check_buf(local_34,local_8,local_10,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_40 = local_10;
  local_88 = *local_10;
  local_84 = local_10[1];
  local_80 = local_10[2];
  local_7c = local_10[3];
  local_48 = &local_88;
  iVar1 = half_btf(local_30[0x10],local_10[4],local_30[0x30],local_10[5],(int)local_11);
  local_48[4] = iVar1;
  iVar1 = half_btf(local_30[0x30],local_40[4],-local_30[0x10],local_40[5],(int)local_11);
  local_48[5] = iVar1;
  iVar1 = half_btf(-local_30[0x30],local_40[6],local_30[0x10],local_40[7],(int)local_11);
  local_48[6] = iVar1;
  iVar1 = half_btf(local_30[0x10],local_40[6],local_30[0x30],local_40[7],(int)local_11);
  local_48[7] = iVar1;
  local_48[8] = local_40[8];
  local_48[9] = local_40[9];
  local_48[10] = local_40[10];
  local_48[0xb] = local_40[0xb];
  iVar1 = half_btf(local_30[0x10],local_40[0xc],local_30[0x30],local_40[0xd],(int)local_11);
  local_48[0xc] = iVar1;
  iVar1 = half_btf(local_30[0x30],local_40[0xc],-local_30[0x10],local_40[0xd],(int)local_11);
  local_48[0xd] = iVar1;
  iVar1 = half_btf(-local_30[0x30],local_40[0xe],local_30[0x10],local_40[0xf],(int)local_11);
  local_48[0xe] = iVar1;
  iVar1 = half_btf(local_30[0x10],local_40[0xe],local_30[0x30],local_40[0xf],(int)local_11);
  local_48[0xf] = iVar1;
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = local_88 + local_78;
  local_10[1] = local_84 + local_74;
  local_10[2] = local_80 + local_70;
  local_10[3] = local_7c + local_6c;
  local_10[4] = local_88 - local_78;
  local_10[5] = local_84 - local_74;
  local_10[6] = local_80 - local_70;
  local_10[7] = local_7c - local_6c;
  local_10[8] = local_68 + local_58;
  local_10[9] = local_64 + local_54;
  local_10[10] = local_60 + local_50;
  local_10[0xb] = local_5c + local_4c;
  local_10[0xc] = local_68 - local_58;
  local_10[0xd] = local_64 - local_54;
  local_10[0xe] = local_60 - local_50;
  local_10[0xf] = local_5c - local_4c;
  local_40 = &local_88;
  av1_range_check_buf(local_34,local_8,local_10,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_40 = local_10;
  local_88 = *local_10;
  local_84 = local_10[1];
  local_80 = local_10[2];
  local_7c = local_10[3];
  local_78 = local_10[4];
  local_74 = local_10[5];
  local_70 = local_10[6];
  local_6c = local_10[7];
  local_48 = &local_88;
  iVar1 = half_btf(local_30[8],local_10[8],local_30[0x38],local_10[9],(int)local_11);
  local_48[8] = iVar1;
  iVar1 = half_btf(local_30[0x38],local_40[8],-local_30[8],local_40[9],(int)local_11);
  local_48[9] = iVar1;
  iVar1 = half_btf(local_30[0x28],local_40[10],local_30[0x18],local_40[0xb],(int)local_11);
  local_48[10] = iVar1;
  iVar1 = half_btf(local_30[0x18],local_40[10],-local_30[0x28],local_40[0xb],(int)local_11);
  local_48[0xb] = iVar1;
  iVar1 = half_btf(-local_30[0x38],local_40[0xc],local_30[8],local_40[0xd],(int)local_11);
  local_48[0xc] = iVar1;
  iVar1 = half_btf(local_30[8],local_40[0xc],local_30[0x38],local_40[0xd],(int)local_11);
  local_48[0xd] = iVar1;
  iVar1 = half_btf(-local_30[0x18],local_40[0xe],local_30[0x28],local_40[0xf],(int)local_11);
  local_48[0xe] = iVar1;
  iVar1 = half_btf(local_30[0x28],local_40[0xe],local_30[0x18],local_40[0xf],(int)local_11);
  local_48[0xf] = iVar1;
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = local_88 + local_68;
  local_10[1] = local_84 + local_64;
  local_10[2] = local_80 + local_60;
  local_10[3] = local_7c + local_5c;
  local_10[4] = local_78 + local_58;
  local_10[5] = local_74 + local_54;
  local_10[6] = local_70 + local_50;
  local_10[7] = local_6c + local_4c;
  local_10[8] = local_88 - local_68;
  local_10[9] = local_84 - local_64;
  local_10[10] = local_80 - local_60;
  local_10[0xb] = local_7c - local_5c;
  local_10[0xc] = local_78 - local_58;
  local_10[0xd] = local_74 - local_54;
  local_10[0xe] = local_70 - local_50;
  local_10[0xf] = local_6c - local_4c;
  local_40 = &local_88;
  av1_range_check_buf(local_34,local_8,local_10,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_40 = local_10;
  local_48 = &local_88;
  iVar1 = half_btf(local_30[2],*local_10,local_30[0x3e],local_10[1],(int)local_11);
  *local_48 = iVar1;
  iVar1 = half_btf(local_30[0x3e],*local_40,-local_30[2],local_40[1],(int)local_11);
  local_48[1] = iVar1;
  iVar1 = half_btf(local_30[10],local_40[2],local_30[0x36],local_40[3],(int)local_11);
  local_48[2] = iVar1;
  iVar1 = half_btf(local_30[0x36],local_40[2],-local_30[10],local_40[3],(int)local_11);
  local_48[3] = iVar1;
  iVar1 = half_btf(local_30[0x12],local_40[4],local_30[0x2e],local_40[5],(int)local_11);
  local_48[4] = iVar1;
  iVar1 = half_btf(local_30[0x2e],local_40[4],-local_30[0x12],local_40[5],(int)local_11);
  local_48[5] = iVar1;
  iVar1 = half_btf(local_30[0x1a],local_40[6],local_30[0x26],local_40[7],(int)local_11);
  local_48[6] = iVar1;
  iVar1 = half_btf(local_30[0x26],local_40[6],-local_30[0x1a],local_40[7],(int)local_11);
  local_48[7] = iVar1;
  iVar1 = half_btf(local_30[0x22],local_40[8],local_30[0x1e],local_40[9],(int)local_11);
  local_48[8] = iVar1;
  iVar1 = half_btf(local_30[0x1e],local_40[8],-local_30[0x22],local_40[9],(int)local_11);
  local_48[9] = iVar1;
  iVar1 = half_btf(local_30[0x2a],local_40[10],local_30[0x16],local_40[0xb],(int)local_11);
  local_48[10] = iVar1;
  iVar1 = half_btf(local_30[0x16],local_40[10],-local_30[0x2a],local_40[0xb],(int)local_11);
  local_48[0xb] = iVar1;
  iVar1 = half_btf(local_30[0x32],local_40[0xc],local_30[0xe],local_40[0xd],(int)local_11);
  local_48[0xc] = iVar1;
  iVar1 = half_btf(local_30[0xe],local_40[0xc],-local_30[0x32],local_40[0xd],(int)local_11);
  local_48[0xd] = iVar1;
  iVar1 = half_btf(local_30[0x3a],local_40[0xe],local_30[6],local_40[0xf],(int)local_11);
  local_48[0xe] = iVar1;
  iVar1 = half_btf(local_30[6],local_40[0xe],-local_30[0x3a],local_40[0xf],(int)local_11);
  local_48[0xf] = iVar1;
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = local_84;
  local_10[1] = local_50;
  local_10[2] = local_7c;
  local_10[3] = local_58;
  local_10[4] = local_74;
  local_10[5] = local_60;
  local_10[6] = local_6c;
  local_10[7] = local_68;
  local_10[8] = local_64;
  local_10[9] = local_70;
  local_10[10] = local_5c;
  local_10[0xb] = local_78;
  local_10[0xc] = local_54;
  local_10[0xd] = local_80;
  local_10[0xe] = local_4c;
  local_10[0xf] = local_88;
  local_40 = &local_88;
  av1_range_check_buf(local_34,local_8,local_10,0x10,local_20[local_34]);
  return;
}

Assistant:

void av1_fadst16(const int32_t *input, int32_t *output, int8_t cos_bit,
                 const int8_t *stage_range) {
  const int32_t size = 16;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  assert(output != input);
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = -input[15];
  bf1[2] = -input[7];
  bf1[3] = input[8];
  bf1[4] = -input[3];
  bf1[5] = input[12];
  bf1[6] = input[4];
  bf1[7] = -input[11];
  bf1[8] = -input[1];
  bf1[9] = input[14];
  bf1[10] = input[6];
  bf1[11] = -input[9];
  bf1[12] = input[2];
  bf1[13] = -input[13];
  bf1[14] = -input[5];
  bf1[15] = input[10];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(cospi[32], bf0[10], cospi[32], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[32], bf0[10], -cospi[32], bf0[11], cos_bit);
  bf1[12] = bf0[12];
  bf1[13] = bf0[13];
  bf1[14] = half_btf(cospi[32], bf0[14], cospi[32], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[32], bf0[14], -cospi[32], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[2];
  bf1[1] = bf0[1] + bf0[3];
  bf1[2] = bf0[0] - bf0[2];
  bf1[3] = bf0[1] - bf0[3];
  bf1[4] = bf0[4] + bf0[6];
  bf1[5] = bf0[5] + bf0[7];
  bf1[6] = bf0[4] - bf0[6];
  bf1[7] = bf0[5] - bf0[7];
  bf1[8] = bf0[8] + bf0[10];
  bf1[9] = bf0[9] + bf0[11];
  bf1[10] = bf0[8] - bf0[10];
  bf1[11] = bf0[9] - bf0[11];
  bf1[12] = bf0[12] + bf0[14];
  bf1[13] = bf0[13] + bf0[15];
  bf1[14] = bf0[12] - bf0[14];
  bf1[15] = bf0[13] - bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = bf0[10];
  bf1[11] = bf0[11];
  bf1[12] = half_btf(cospi[16], bf0[12], cospi[48], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[48], bf0[12], -cospi[16], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[48], bf0[14], cospi[16], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[16], bf0[14], cospi[48], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[4];
  bf1[1] = bf0[1] + bf0[5];
  bf1[2] = bf0[2] + bf0[6];
  bf1[3] = bf0[3] + bf0[7];
  bf1[4] = bf0[0] - bf0[4];
  bf1[5] = bf0[1] - bf0[5];
  bf1[6] = bf0[2] - bf0[6];
  bf1[7] = bf0[3] - bf0[7];
  bf1[8] = bf0[8] + bf0[12];
  bf1[9] = bf0[9] + bf0[13];
  bf1[10] = bf0[10] + bf0[14];
  bf1[11] = bf0[11] + bf0[15];
  bf1[12] = bf0[8] - bf0[12];
  bf1[13] = bf0[9] - bf0[13];
  bf1[14] = bf0[10] - bf0[14];
  bf1[15] = bf0[11] - bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[8], bf0[8], cospi[56], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[56], bf0[8], -cospi[8], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[40], bf0[10], cospi[24], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[24], bf0[10], -cospi[40], bf0[11], cos_bit);
  bf1[12] = half_btf(-cospi[56], bf0[12], cospi[8], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[8], bf0[12], cospi[56], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[24], bf0[14], cospi[40], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[40], bf0[14], cospi[24], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[8];
  bf1[1] = bf0[1] + bf0[9];
  bf1[2] = bf0[2] + bf0[10];
  bf1[3] = bf0[3] + bf0[11];
  bf1[4] = bf0[4] + bf0[12];
  bf1[5] = bf0[5] + bf0[13];
  bf1[6] = bf0[6] + bf0[14];
  bf1[7] = bf0[7] + bf0[15];
  bf1[8] = bf0[0] - bf0[8];
  bf1[9] = bf0[1] - bf0[9];
  bf1[10] = bf0[2] - bf0[10];
  bf1[11] = bf0[3] - bf0[11];
  bf1[12] = bf0[4] - bf0[12];
  bf1[13] = bf0[5] - bf0[13];
  bf1[14] = bf0[6] - bf0[14];
  bf1[15] = bf0[7] - bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 8
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[2], bf0[0], cospi[62], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[62], bf0[0], -cospi[2], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[10], bf0[2], cospi[54], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[54], bf0[2], -cospi[10], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[18], bf0[4], cospi[46], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[46], bf0[4], -cospi[18], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[26], bf0[6], cospi[38], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[38], bf0[6], -cospi[26], bf0[7], cos_bit);
  bf1[8] = half_btf(cospi[34], bf0[8], cospi[30], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[30], bf0[8], -cospi[34], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[42], bf0[10], cospi[22], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[22], bf0[10], -cospi[42], bf0[11], cos_bit);
  bf1[12] = half_btf(cospi[50], bf0[12], cospi[14], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[14], bf0[12], -cospi[50], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[58], bf0[14], cospi[6], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[6], bf0[14], -cospi[58], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 9
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[1];
  bf1[1] = bf0[14];
  bf1[2] = bf0[3];
  bf1[3] = bf0[12];
  bf1[4] = bf0[5];
  bf1[5] = bf0[10];
  bf1[6] = bf0[7];
  bf1[7] = bf0[8];
  bf1[8] = bf0[9];
  bf1[9] = bf0[6];
  bf1[10] = bf0[11];
  bf1[11] = bf0[4];
  bf1[12] = bf0[13];
  bf1[13] = bf0[2];
  bf1[14] = bf0[15];
  bf1[15] = bf0[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}